

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_uri(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  xmlChar *pxVar7;
  FILE *__stream;
  xmlChar *pxVar8;
  int n_URI;
  ulong uVar9;
  bool bVar10;
  int test_ret_1;
  undefined8 *puVar11;
  xmlChar *in_RSI;
  int iVar12;
  int test_ret_3;
  int n_path;
  uint uVar13;
  int test_ret_5;
  int local_38;
  int test_ret;
  
  if (quiet == '\0') {
    puts("Testing uri : 13 of 18 functions ...");
  }
  test_ret = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    pxVar7 = (xmlChar *)0x0;
    while( true ) {
      iVar2 = (int)in_RSI;
      iVar12 = (int)pxVar7;
      if (iVar12 == 5) break;
      iVar1 = xmlMemBlocks();
      gen_const_xmlChar_ptr(uVar13,iVar2);
      in_RSI = gen_const_xmlChar_ptr(iVar12,iVar2);
      lVar6 = xmlBuildRelativeURI();
      if (lVar6 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildRelativeURI",(ulong)(uint)(iVar2 - iVar1));
        test_ret = test_ret + 1;
        printf(" %d",(ulong)uVar13);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      pxVar7 = (xmlChar *)(ulong)(iVar12 + 1);
    }
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  uVar9 = 0;
  while (iVar2 = (int)uVar9, iVar2 != 5) {
    for (iVar12 = 0; iVar12 != 5; iVar12 = iVar12 + 1) {
      bVar10 = true;
      while (iVar1 = (int)in_RSI, bVar10) {
        iVar3 = xmlMemBlocks();
        pxVar7 = gen_const_xmlChar_ptr(iVar2,iVar1);
        in_RSI = gen_const_xmlChar_ptr(iVar12,iVar1);
        xmlBuildRelativeURISafe(pxVar7,in_RSI,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar1 = xmlMemBlocks();
        if (iVar3 == iVar1) break;
        iVar1 = xmlMemBlocks();
        bVar10 = false;
        printf("Leak of %d blocks found in xmlBuildRelativeURISafe",(ulong)(uint)(iVar1 - iVar3));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",uVar9);
        printf(" %d");
        in_RSI = (xmlChar *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
    uVar9 = (ulong)(iVar2 + 1);
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    pxVar7 = (xmlChar *)0x0;
    while( true ) {
      iVar12 = (int)in_RSI;
      iVar1 = (int)pxVar7;
      if (iVar1 == 5) break;
      iVar3 = xmlMemBlocks();
      gen_const_xmlChar_ptr(uVar13,iVar12);
      in_RSI = gen_const_xmlChar_ptr(iVar1,iVar12);
      lVar6 = xmlBuildURI();
      if (lVar6 != 0) {
        (*_xmlFree)();
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar3 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlBuildURI",(ulong)(uint)(iVar12 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar13);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      pxVar7 = (xmlChar *)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    for (iVar1 = 0; iVar1 != 5; iVar1 = iVar1 + 1) {
      bVar10 = true;
      while (iVar3 = (int)in_RSI, bVar10) {
        iVar4 = xmlMemBlocks();
        pxVar7 = gen_const_xmlChar_ptr(uVar13,iVar3);
        in_RSI = gen_const_xmlChar_ptr(iVar1,iVar3);
        xmlBuildURISafe(pxVar7,in_RSI,0);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar4 == iVar3) break;
        iVar3 = xmlMemBlocks();
        bVar10 = false;
        printf("Leak of %d blocks found in xmlBuildURISafe",(ulong)(uint)(iVar3 - iVar4));
        iVar12 = iVar12 + 1;
        printf(" %d",(ulong)uVar13);
        printf(" %d");
        in_RSI = (xmlChar *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar1 = 0;
  pxVar7 = (xmlChar *)0x0;
  while (iVar3 = (int)pxVar7, iVar3 != 5) {
    iVar4 = xmlMemBlocks();
    gen_const_xmlChar_ptr(iVar3,(int)in_RSI);
    lVar6 = xmlCanonicPath();
    if (lVar6 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar5 = xmlMemBlocks();
    if (iVar4 != iVar5) {
      iVar5 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCanonicPath",(ulong)(uint)(iVar5 - iVar4));
      iVar1 = iVar1 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = pxVar7;
    }
    pxVar7 = (xmlChar *)(ulong)(iVar3 + 1);
  }
  function_tests = function_tests + 1;
  local_38 = -(iVar2 + iVar12 + test_ret + test_ret_5 + iVar1);
  bVar10 = true;
  while (bVar10) {
    iVar2 = xmlMemBlocks();
    xmlNormalizeURIPath(0);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar2 == iVar12) break;
    xmlMemBlocks();
    bVar10 = false;
    printf("Leak of %d blocks found in xmlNormalizeURIPath");
    in_RSI = (xmlChar *)0x0;
    printf(" %d");
    putchar(10);
    local_38 = local_38 + -1;
  }
  function_tests = function_tests + 1;
  bVar10 = true;
  test_ret_5 = 0;
  while (bVar10) {
    puVar11 = &DAT_0015bd68;
    pxVar7 = (xmlChar *)0x0;
    while (uVar13 = (uint)pxVar7, uVar13 != 4) {
      iVar2 = xmlMemBlocks();
      if (uVar13 < 3) {
        in_RSI = (xmlChar *)*puVar11;
      }
      else {
        in_RSI = (xmlChar *)0x0;
      }
      xmlParseURIReference();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar2 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlParseURIReference",(ulong)(uint)(iVar12 - iVar2));
        test_ret_5 = test_ret_5 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      puVar11 = puVar11 + 1;
      pxVar7 = (xmlChar *)(ulong)(uVar13 + 1);
    }
    bVar10 = false;
  }
  function_tests = function_tests + 1;
  iVar12 = 0;
  for (iVar2 = 0; iVar2 != 8; iVar2 = iVar2 + 1) {
    bVar10 = true;
    while (iVar1 = (int)in_RSI, bVar10) {
      iVar3 = xmlMemBlocks();
      gen_filepath(iVar2,iVar1);
      in_RSI = (xmlChar *)0x0;
      xmlParseURISafe();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar1 = xmlMemBlocks();
      if (iVar3 == iVar1) break;
      iVar1 = xmlMemBlocks();
      bVar10 = false;
      printf("Leak of %d blocks found in xmlParseURISafe",(ulong)(uint)(iVar1 - iVar3));
      iVar12 = iVar12 + 1;
      printf(" %d");
      in_RSI = (xmlChar *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    iVar1 = xmlMemBlocks();
    gen_const_xmlChar_ptr(uVar13,(int)in_RSI);
    lVar6 = xmlPathToURI();
    if (lVar6 != 0) {
      (*_xmlFree)();
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar3 = xmlMemBlocks();
    if (iVar1 != iVar3) {
      iVar3 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlPathToURI",(ulong)(uint)(iVar3 - iVar1));
      iVar2 = iVar2 + 1;
      in_RSI = (xmlChar *)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (iVar1 = 0; iVar1 != 2; iVar1 = iVar1 + 1) {
    bVar10 = true;
    while (iVar4 = (int)in_RSI, bVar10) {
      iVar5 = xmlMemBlocks();
      __stream = (FILE *)gen_FILE_ptr(iVar1,iVar4);
      in_RSI = (xmlChar *)0x0;
      xmlPrintURI();
      call_tests = call_tests + 1;
      if (__stream != (FILE *)0x0) {
        fclose(__stream);
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 == iVar4) break;
      iVar4 = xmlMemBlocks();
      bVar10 = false;
      printf("Leak of %d blocks found in xmlPrintURI",(ulong)(uint)(iVar4 - iVar5));
      iVar3 = iVar3 + 1;
      printf(" %d");
      in_RSI = (xmlChar *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_38 = local_38 - (iVar2 + iVar3 + test_ret_5 + iVar12);
  bVar10 = true;
  while (bVar10) {
    iVar2 = xmlMemBlocks();
    lVar6 = xmlSaveUri(0);
    if (lVar6 != 0) {
      (*_xmlFree)(lVar6);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar2 == iVar12) break;
    xmlMemBlocks();
    bVar10 = false;
    printf("Leak of %d blocks found in xmlSaveUri");
    in_RSI = (xmlChar *)0x0;
    printf(" %d");
    putchar(10);
    local_38 = local_38 + -1;
  }
  function_tests = function_tests + 1;
  test_ret_5 = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    iVar2 = xmlMemBlocks();
    pxVar7 = gen_const_xmlChar_ptr(uVar13,(int)in_RSI);
    lVar6 = xmlURIEscape(pxVar7);
    if (lVar6 != 0) {
      (*_xmlFree)(lVar6);
    }
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar2 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlURIEscape",(ulong)(uint)(iVar12 - iVar2));
      test_ret_5 = test_ret_5 + 1;
      in_RSI = (xmlChar *)(ulong)uVar13;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar13 = 0; uVar13 != 5; uVar13 = uVar13 + 1) {
    pxVar7 = (xmlChar *)0x0;
    while( true ) {
      iVar12 = (int)in_RSI;
      iVar1 = (int)pxVar7;
      if (iVar1 == 5) break;
      iVar3 = xmlMemBlocks();
      pxVar8 = gen_const_xmlChar_ptr(uVar13,iVar12);
      in_RSI = gen_const_xmlChar_ptr(iVar1,iVar12);
      lVar6 = xmlURIEscapeStr(pxVar8);
      if (lVar6 != 0) {
        (*_xmlFree)(lVar6);
      }
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar12 = xmlMemBlocks();
      if (iVar3 != iVar12) {
        iVar12 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlURIEscapeStr",(ulong)(uint)(iVar12 - iVar3));
        iVar2 = iVar2 + 1;
        printf(" %d",(ulong)uVar13);
        printf(" %d");
        putchar(10);
        in_RSI = pxVar7;
      }
      pxVar7 = (xmlChar *)(ulong)(iVar1 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar13 = -(local_38 - (test_ret_5 + iVar2));
  if (local_38 != test_ret_5 + iVar2) {
    printf("Module uri: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_uri(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing uri : 13 of 18 functions ...\n");
    test_ret += test_xmlBuildRelativeURI();
    test_ret += test_xmlBuildRelativeURISafe();
    test_ret += test_xmlBuildURI();
    test_ret += test_xmlBuildURISafe();
    test_ret += test_xmlCanonicPath();
    test_ret += test_xmlCreateURI();
    test_ret += test_xmlNormalizeURIPath();
    test_ret += test_xmlParseURI();
    test_ret += test_xmlParseURIRaw();
    test_ret += test_xmlParseURIReference();
    test_ret += test_xmlParseURISafe();
    test_ret += test_xmlPathToURI();
    test_ret += test_xmlPrintURI();
    test_ret += test_xmlSaveUri();
    test_ret += test_xmlURIEscape();
    test_ret += test_xmlURIEscapeStr();
    test_ret += test_xmlURIUnescapeString();

    if (test_ret != 0)
	printf("Module uri: %d errors\n", test_ret);
    return(test_ret);
}